

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscroller.cpp
# Opt level: O0

void QScroller::ungrabGesture(QObject *target)

{
  bool bVar1;
  QWidget *this;
  QGraphicsObject *pQVar2;
  undefined8 in_RDI;
  QGraphicsObject *go;
  QWidget *widget;
  QScrollerPrivate *sp;
  QScroller *s;
  QObject *in_stack_00000028;
  QGraphicsObject *in_stack_ffffffffffffffe0;
  GestureType gesture;
  QScrollerPrivate *pQVar3;
  
  gesture = (GestureType)((ulong)in_RDI >> 0x20);
  this = (QWidget *)scroller(in_stack_00000028);
  if ((this != (QWidget *)0x0) &&
     (pQVar3 = *(QScrollerPrivate **)&this->super_QPaintDevice,
     pQVar3->recognizer != (QFlickGestureRecognizer *)0x0)) {
    bVar1 = QObject::isWidgetType((QObject *)0xa809cf);
    if (bVar1) {
      QWidget::ungrabGesture(this,gesture);
    }
    else {
      pQVar2 = qobject_cast<QGraphicsObject*>((QObject *)0xa809fd);
      if (pQVar2 != (QGraphicsObject *)0x0) {
        QGraphicsObject::ungrabGesture
                  (in_stack_ffffffffffffffe0,(GestureType)((ulong)pQVar3 >> 0x20));
      }
      gesture = (GestureType)((ulong)in_stack_ffffffffffffffe0 >> 0x20);
    }
    QGestureRecognizer::unregisterRecognizer(gesture);
    pQVar3->recognizer = (QFlickGestureRecognizer *)0x0;
  }
  return;
}

Assistant:

void QScroller::ungrabGesture(QObject *target)
{
    QScroller *s = scroller(target);
    if (!s)
        return;

    QScrollerPrivate *sp = s->d_ptr;
    if (!sp->recognizer)
        return; // nothing to do

    if (target->isWidgetType()) {
        QWidget *widget = static_cast<QWidget *>(target);
        widget->ungrabGesture(sp->recognizerType);
#if QT_CONFIG(graphicsview)
    } else if (QGraphicsObject *go = qobject_cast<QGraphicsObject*>(target)) {
        go->ungrabGesture(sp->recognizerType);
#endif
    }

    QGestureRecognizer::unregisterRecognizer(sp->recognizerType);
    // do not delete the recognizer. The QGestureManager is doing this.
    sp->recognizer = nullptr;
}